

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npbminput.cc
# Opt level: O1

int __thiscall NpbmInput::open(NpbmInput *this,char *__file,int __oflag,...)

{
  undefined8 *puVar1;
  istream *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  
  if ((this->super_ImageInput).isp != (istream *)0x0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->currentLine,0,(char *)(this->currentLine)._M_string_length,0x219e6c);
    this->pos = 0;
    piVar2 = (this->super_ImageInput).isp;
    lVar5 = *(long *)(*(long *)piVar2 + -0x18);
    *(undefined4 *)(piVar2 + lVar5 + 0x1c) = 7;
    std::ios::clear((int)piVar2 + (int)lVar5);
    readImageHeaders(this);
    seekSubimage(this,0,0);
    lVar5 = *(long *)&(this->super_ImageInput).images;
    lVar6 = (ulong)(this->super_ImageInput).curSubimage * 0x90;
    puVar1 = (undefined8 *)(lVar5 + lVar6);
    uVar3 = puVar1[1];
    *(undefined8 *)__file = *puVar1;
    *(undefined8 *)(__file + 8) = uVar3;
    *(undefined8 *)(__file + 0x10) = puVar1[2];
    *(undefined4 *)(__file + 0x18) = *(undefined4 *)(puVar1 + 3);
    std::__cxx11::string::_M_assign((string *)(__file + 0x20));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__file + 0x40),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar5 + lVar6 + 0x40));
    lVar5 = lVar5 + lVar6;
    std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::operator=
              ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
               (__file + 0x58),
               (vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
               (lVar5 + 0x58));
    uVar3 = *(undefined8 *)(lVar5 + 0x70);
    uVar4 = *(undefined8 *)(lVar5 + 0x77);
    *(undefined8 *)(__file + 0x70) = uVar3;
    *(undefined8 *)(__file + 0x77) = uVar4;
    return (int)uVar3;
  }
  __assert_fail("isp != nullptr && \"istream not initialized\"",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/npbm.imageio/npbminput.cc"
                ,0x5d,"virtual void NpbmInput::open(ImageSpec &)");
}

Assistant:

void
NpbmInput::open(ImageSpec& newspec)
{
    assert(isp != nullptr && "istream not initialized");
    currentLine = "";
    pos         = 0;

    isp->exceptions(std::istream::failbit | std::istream::badbit | std::istream::eofbit );
    readImageHeaders();
    seekSubimage(0);
    newspec = spec();
}